

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp0_fast_moreThen5(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  bVar2 = (char)iVar - 6;
  uVar7 = 1 << (bVar2 & 0x1f);
  iVar8 = -4 << (bVar2 & 0x1f);
  uVar3 = nWords - 1;
  iVar1 = 0;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  iVar4 = nWords + (-3 << (bVar2 & 0x1f)) + -1;
  do {
    if ((int)uVar3 < 0) {
      iVar8 = 0;
LAB_0048a7c7:
      *pDifStart = iVar8;
      return iVar1;
    }
    for (lVar5 = 0; -lVar5 != (ulong)uVar7; lVar5 = lVar5 + -1) {
      iVar6 = -(uint)(pInOut[(ulong)uVar3 + lVar5] < pInOut[iVar4 + (int)lVar5]);
      if (pInOut[iVar4 + (int)lVar5] < pInOut[(ulong)uVar3 + lVar5]) {
        iVar6 = 1;
      }
      if (iVar6 != 0) {
        iVar8 = uVar3 + 1;
        iVar1 = 0;
        if (iVar6 != -1) {
          iVar1 = 3;
        }
        goto LAB_0048a7c7;
      }
    }
    uVar3 = uVar3 + iVar8;
    iVar4 = iVar4 + iVar8;
  } while( true );
}

Assistant:

int minTemp0_fast_moreThen5(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int wordDif = 3*wordBlock;
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp0_fast_moreThen5\n");

    for(i=nWords - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j],pInOut[i-j-wordDif]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 3;
            }
        }
    *pDifStart=0;
//    printf("out minTemp0_fast_moreThen5\n");

    return 0;
}